

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall
vkb::PhysicalDevice::enable_extension_if_present(PhysicalDevice *this,char *extension)

{
  int iVar1;
  long lVar2;
  pointer pbVar3;
  long lVar4;
  pointer pbVar5;
  allocator<char> local_59;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar5 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->available_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_58 - (long)pbVar5;
  if (0 < lVar4 >> 7) {
    lVar2 = (lVar4 >> 7) + 1;
    do {
      iVar1 = std::__cxx11::string::compare((char *)pbVar5);
      pbVar3 = pbVar5;
      if (iVar1 == 0) goto LAB_00107188;
      iVar1 = std::__cxx11::string::compare((char *)(pbVar5 + 1));
      pbVar3 = pbVar5 + 1;
      if (iVar1 == 0) goto LAB_00107188;
      iVar1 = std::__cxx11::string::compare((char *)(pbVar5 + 2));
      pbVar3 = pbVar5 + 2;
      if (iVar1 == 0) goto LAB_00107188;
      iVar1 = std::__cxx11::string::compare((char *)(pbVar5 + 3));
      pbVar3 = pbVar5 + 3;
      if (iVar1 == 0) goto LAB_00107188;
      pbVar5 = pbVar5 + 4;
      lVar2 = lVar2 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar2);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    pbVar3 = pbVar5;
    if (lVar4 != 2) {
      pbVar3 = local_58;
      if ((lVar4 != 3) ||
         (iVar1 = std::__cxx11::string::compare((char *)pbVar5), pbVar3 = pbVar5, iVar1 == 0))
      goto LAB_00107188;
      pbVar3 = pbVar5 + 1;
    }
    iVar1 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar1 == 0) goto LAB_00107188;
    pbVar5 = pbVar3 + 1;
  }
  iVar1 = std::__cxx11::string::compare((char *)pbVar5);
  pbVar3 = local_58;
  if (iVar1 == 0) {
    pbVar3 = pbVar5;
  }
LAB_00107188:
  pbVar5 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,extension,&local_59);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->extensions_to_enable,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return pbVar3 != pbVar5;
}

Assistant:

bool PhysicalDevice::enable_extension_if_present(const char* extension) {
    auto it = std::find_if(std::begin(available_extensions),
        std::end(available_extensions),
        [extension](std::string const& ext_name) { return ext_name == extension; });
    if (it != std::end(available_extensions)) {
        extensions_to_enable.push_back(extension);
        return true;
    }
    return false;
}